

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long in_RCX;
  long *in_RDX;
  int *in_R8;
  Char c;
  int index;
  int unicode;
  allocator local_91;
  string local_90 [35];
  char local_6d;
  int local_6c;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  undefined4 in_stack_ffffffffffffff9c;
  Token *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  Reader *in_stack_ffffffffffffffb0;
  bool local_1;
  
  if (in_RCX - *in_RDX < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,
               "Bad unicode escape sequence in string: four digits expected.",
               (allocator *)&stack0xffffffffffffffaf);
    local_1 = addError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,(Location)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  else {
    iVar4 = 0;
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      pcVar1 = (char *)*in_RDX;
      *in_RDX = (long)(pcVar1 + 1);
      local_6d = *pcVar1;
      iVar4 = iVar4 * 0x10;
      if ((local_6d < '0') || ('9' < local_6d)) {
        if ((local_6d < 'a') || ('f' < local_6d)) {
          if ((local_6d < 'A') || ('F' < local_6d)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_90,"Bad unicode escape sequence in string: hexadecimal digit expected."
                       ,&local_91);
            bVar2 = addError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0,
                             (Location)CONCAT44(in_stack_ffffffffffffff9c,iVar4));
            std::__cxx11::string::~string(local_90);
            std::allocator<char>::~allocator((allocator<char> *)&local_91);
            return bVar2;
          }
          iVar3 = local_6d + -0x37;
        }
        else {
          iVar3 = local_6d + -0x57;
        }
      }
      else {
        iVar3 = local_6d + -0x30;
      }
      iVar4 = iVar3 + iVar4;
    }
    *in_R8 = iVar4;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.", token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token, current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}